

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall spdlog::file_event_handlers::~file_event_handlers(file_event_handlers *this)

{
  _Manager_type p_Var1;
  
  p_Var1 = (this->after_close).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->after_close,(_Any_data *)&this->after_close,__destroy_functor);
  }
  p_Var1 = (this->before_close).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->before_close,(_Any_data *)&this->before_close,__destroy_functor);
  }
  p_Var1 = (this->after_open).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->after_open,(_Any_data *)&this->after_open,__destroy_functor);
  }
  p_Var1 = (this->before_open).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)this,(_Any_data *)this,__destroy_functor);
  }
  return;
}

Assistant:

file_event_handlers()
        : before_open(nullptr),
          after_open(nullptr),
          before_close(nullptr),
          after_close(nullptr) {}